

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O3

opensshcert_key * opensshcert_new_shared(ssh_keyalg *self,ptrlen blob,strbuf **basepub_out)

{
  ptrlen *ppVar1;
  uint uVar2;
  long *plVar3;
  void *pvVar4;
  _Bool _Var5;
  opensshcert_key *poVar6;
  strbuf *psVar7;
  long lVar8;
  uint64_t uVar9;
  unsigned_long uVar10;
  strbuf *psVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  size_t i;
  long lVar15;
  ptrlen pVar16;
  ptrlen pl1;
  BinarySource src [1];
  void *local_90;
  BinarySource local_88;
  opensshcert_key *local_60;
  strbuf **local_58;
  strbuf *local_50;
  long *local_48;
  long local_40;
  long local_38;
  
  local_88.len = blob.len;
  local_88.data = blob.ptr;
  plVar3 = (long *)self->extra;
  local_88.binarysource_ = &local_88;
  local_88.pos = 0;
  local_88.err = BSE_NO_ERROR;
  pVar16 = BinarySource_get_string(local_88.binarysource_);
  _Var5 = ptrlen_eq_string(pVar16,(char *)plVar3[6]);
  if (_Var5) {
    local_90 = (void *)0x0;
    poVar6 = (opensshcert_key *)safemalloc(1,0x70,0);
    poVar6->nonce = (strbuf *)0x0;
    poVar6->serial = 0;
    *(undefined8 *)&poVar6->type = 0;
    poVar6->key_id = (strbuf *)0x0;
    poVar6->valid_principals = (strbuf *)0x0;
    poVar6->valid_after = 0;
    poVar6->valid_before = 0;
    poVar6->critical_options = (strbuf *)0x0;
    poVar6->extensions = (strbuf *)0x0;
    poVar6->reserved = (strbuf *)0x0;
    poVar6->signature_key = (strbuf *)0x0;
    poVar6->signature = (strbuf *)0x0;
    poVar6->basekey = (ssh_key *)0x0;
    (poVar6->sshk).vt = self;
    pVar16 = BinarySource_get_string(local_88.binarysource_);
    psVar7 = strbuf_dup(pVar16);
    poVar6->nonce = psVar7;
    psVar7 = strbuf_new();
    BinarySink_put_stringz(psVar7->binarysink_,(char *)plVar3[7]);
    lVar15 = plVar3[1];
    if (lVar15 != 0) {
      local_38 = *plVar3;
      lVar8 = 0;
      uVar13 = 0;
      do {
        uVar14 = uVar13;
        uVar12 = (ulong)(*(int *)(local_38 + lVar8 * 4) + 1);
        uVar13 = uVar12;
        if (uVar12 < uVar14) {
          uVar13 = uVar14;
        }
        lVar8 = lVar8 + 1;
      } while (lVar15 != lVar8);
      local_60 = poVar6;
      local_58 = basepub_out;
      local_50 = psVar7;
      local_48 = plVar3;
      local_40 = lVar15;
      if (uVar13 == 0) {
        local_90 = (void *)0x0;
      }
      else {
        local_90 = saferealloc((void *)0x0,uVar13,0x10);
        memset(local_90,0,uVar13 << 4);
      }
      lVar15 = 0;
      do {
        uVar2 = *(uint *)(local_38 + lVar15 * 4);
        pVar16 = BinarySource_get_string(local_88.binarysource_);
        lVar8 = (ulong)uVar2 * 0x10;
        ppVar1 = (ptrlen *)((long)local_90 + lVar8);
        pvVar4 = *(void **)((long)local_90 + lVar8);
        if ((pvVar4 != (void *)0x0) &&
           (pl1.len = ppVar1->len, pl1.ptr = pvVar4, _Var5 = ptrlen_eq_ptrlen(pl1,pVar16), !_Var5))
        break;
        *ppVar1 = pVar16;
        lVar15 = lVar15 + 1;
      } while (local_40 != lVar15);
      psVar7 = local_50;
      uVar13 = local_48[1];
      basepub_out = local_58;
      poVar6 = local_60;
      if (uVar13 != 0) {
        lVar15 = *local_48;
        if (uVar12 < uVar14) {
          uVar12 = uVar14;
        }
        uVar14 = 0;
        do {
          if (uVar12 == uVar14) {
            __assert_fail("i < bt->nparts",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/openssh-certs.c"
                          ,0xb5,"void blobtrans_write(BlobTransformer *, BinarySink *, blob_fmt)");
          }
          lVar8 = (ulong)*(uint *)(lVar15 + uVar14 * 4) * 0x10;
          pvVar4 = *(void **)((long)local_90 + lVar8);
          if (pvVar4 == (void *)0x0) {
            __assert_fail("part.ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/openssh-certs.c"
                          ,0xb7,"void blobtrans_write(BlobTransformer *, BinarySink *, blob_fmt)");
          }
          pVar16.len = *(size_t *)((long)local_90 + lVar8 + 8);
          pVar16.ptr = pvVar4;
          BinarySink_put_stringpl(psVar7->binarysink_[0].binarysink_,pVar16);
          uVar14 = uVar14 + 1;
          basepub_out = local_58;
          poVar6 = local_60;
        } while (uVar13 != uVar14);
      }
    }
    safefree(local_90);
    uVar9 = BinarySource_get_uint64(local_88.binarysource_);
    poVar6->serial = uVar9;
    uVar10 = BinarySource_get_uint32(local_88.binarysource_);
    poVar6->type = (uint32_t)uVar10;
    pVar16 = BinarySource_get_string(local_88.binarysource_);
    psVar11 = strbuf_dup(pVar16);
    poVar6->key_id = psVar11;
    pVar16 = BinarySource_get_string(local_88.binarysource_);
    psVar11 = strbuf_dup(pVar16);
    poVar6->valid_principals = psVar11;
    uVar9 = BinarySource_get_uint64(local_88.binarysource_);
    poVar6->valid_after = uVar9;
    uVar9 = BinarySource_get_uint64(local_88.binarysource_);
    poVar6->valid_before = uVar9;
    pVar16 = BinarySource_get_string(local_88.binarysource_);
    psVar11 = strbuf_dup(pVar16);
    poVar6->critical_options = psVar11;
    pVar16 = BinarySource_get_string(local_88.binarysource_);
    psVar11 = strbuf_dup(pVar16);
    poVar6->extensions = psVar11;
    pVar16 = BinarySource_get_string(local_88.binarysource_);
    psVar11 = strbuf_dup(pVar16);
    poVar6->reserved = psVar11;
    pVar16 = BinarySource_get_string(local_88.binarysource_);
    psVar11 = strbuf_dup(pVar16);
    poVar6->signature_key = psVar11;
    pVar16 = BinarySource_get_string(local_88.binarysource_);
    psVar11 = strbuf_dup(pVar16);
    poVar6->signature = psVar11;
    if ((local_88.binarysource_)->err == BSE_NO_ERROR) {
      *basepub_out = psVar7;
      return poVar6;
    }
    (*((poVar6->sshk).vt)->freekey)(&poVar6->sshk);
    strbuf_free(psVar7);
  }
  return (opensshcert_key *)0x0;
}

Assistant:

static opensshcert_key *opensshcert_new_shared(
    const ssh_keyalg *self, ptrlen blob, strbuf **basepub_out)
{
    const opensshcert_extra *extra = self->extra;

    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, blob);

    /* Check the initial key-type string */
    if (!ptrlen_eq_string(get_string(src), extra->cert_key_ssh_id))
        return NULL;

    opensshcert_key *ck = snew(opensshcert_key);
    memset(ck, 0, sizeof(*ck));
    ck->sshk.vt = self;

    ck->nonce = strbuf_dup(get_string(src));
    strbuf *basepub = strbuf_new();
    {
        put_stringz(basepub, extra->base_key_ssh_id);

        /* Make the base public key blob out of the public key
         * material in the certificate. This invocation of the
         * blobtrans system doesn't do any format translation, but it
         * does ensure that the right amount of data is copied so that
         * src ends up in the right position to read the remaining
         * certificate fields. */
        BLOBTRANS_DECLARE(bt);
        blobtrans_read(bt, src, extra->pub_fmt);
        blobtrans_write(bt, BinarySink_UPCAST(basepub), extra->pub_fmt);
        blobtrans_clear(bt);
    }
    ck->serial = get_uint64(src);
    ck->type = get_uint32(src);
    ck->key_id = strbuf_dup(get_string(src));
    ck->valid_principals = strbuf_dup(get_string(src));
    ck->valid_after = get_uint64(src);
    ck->valid_before = get_uint64(src);
    ck->critical_options = strbuf_dup(get_string(src));
    ck->extensions = strbuf_dup(get_string(src));
    ck->reserved = strbuf_dup(get_string(src));
    ck->signature_key = strbuf_dup(get_string(src));
    ck->signature = strbuf_dup(get_string(src));


    if (get_err(src)) {
        ssh_key_free(&ck->sshk);
        strbuf_free(basepub);
        return NULL;
    }

    *basepub_out = basepub;
    return ck;
}